

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SendEventAsync
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,IOTHUB_MESSAGE_HANDLE eventMessageHandle,
          IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK eventConfirmationCallback,
          void *userContextCallback)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  IOTHUB_MESSAGE_LIST *newEntry_00;
  IOTHUB_MESSAGE_HANDLE pIVar4;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l_1;
  IOTHUB_MESSAGE_LIST *newEntry;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *userContextCallback_local;
  IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK eventConfirmationCallback_local;
  IOTHUB_MESSAGE_HANDLE eventMessageHandle_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
      (eventMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0)) ||
     ((eventConfirmationCallback == (IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK)0x0 &&
      (userContextCallback != (void *)0x0)))) {
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_INVALID_ARG);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SendEventAsync",0x764,1,"result = %s",pcVar3);
    }
  }
  else {
    newEntry_00 = (IOTHUB_MESSAGE_LIST *)malloc(0x38);
    if (newEntry_00 == (IOTHUB_MESSAGE_LIST *)0x0) {
      l._4_4_ = IOTHUB_CLIENT_ERROR;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_ERROR);
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SendEventAsync",0x76c,1,"result = %s",pcVar3);
      }
    }
    else {
      iVar1 = attach_ms_timesOutAfter(iotHubClientHandle,newEntry_00);
      if (iVar1 == 0) {
        pIVar4 = IoTHubMessage_Clone(eventMessageHandle);
        newEntry_00->messageHandle = pIVar4;
        if (pIVar4 == (IOTHUB_MESSAGE_HANDLE)0x0) {
          l._4_4_ = IOTHUB_CLIENT_ERROR;
          free(newEntry_00);
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_ERROR);
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_SendEventAsync",0x77e,1,"result = %s",pcVar3);
          }
        }
        else {
          iVar1 = IoTHubClient_Diagnostic_AddIfNecessary
                            (&iotHubClientHandle->diagnostic_setting,newEntry_00->messageHandle);
          if (iVar1 == 0) {
            newEntry_00->callback = eventConfirmationCallback;
            newEntry_00->context = userContextCallback;
            DList_InsertTailList(&iotHubClientHandle->waitingToSend,&newEntry_00->entry);
            l._4_4_ = IOTHUB_CLIENT_OK;
          }
          else {
            l._4_4_ = IOTHUB_CLIENT_ERROR;
            IoTHubMessage_Destroy(newEntry_00->messageHandle);
            free(newEntry_00);
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_ERROR);
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                        ,"IoTHubClientCore_LL_SendEventAsync",0x785,1,"result = %s",pcVar3);
            }
          }
        }
      }
      else {
        l._4_4_ = IOTHUB_CLIENT_ERROR;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_ERROR);
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_SendEventAsync",0x775,1,"result = %s",pcVar3);
        }
        free(newEntry_00);
      }
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SendEventAsync(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_MESSAGE_HANDLE eventMessageHandle, IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK eventConfirmationCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (eventMessageHandle == NULL) ||
        ((eventConfirmationCallback == NULL) && (userContextCallback != NULL))
        )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        IOTHUB_MESSAGE_LIST *newEntry = (IOTHUB_MESSAGE_LIST*)malloc(sizeof(IOTHUB_MESSAGE_LIST));
        if (newEntry == NULL)
        {
            result = IOTHUB_CLIENT_ERROR;
            LOG_ERROR_RESULT;
        }
        else
        {
            IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

            if (attach_ms_timesOutAfter(handleData, newEntry) != 0)
            {
                result = IOTHUB_CLIENT_ERROR;
                LOG_ERROR_RESULT;
                free(newEntry);
            }
            else
            {
                if ((newEntry->messageHandle = IoTHubMessage_Clone(eventMessageHandle)) == NULL)
                {
                    result = IOTHUB_CLIENT_ERROR;
                    free(newEntry);
                    LOG_ERROR_RESULT;
                }
                else if (IoTHubClient_Diagnostic_AddIfNecessary(&handleData->diagnostic_setting, newEntry->messageHandle) != 0)
                {
                    result = IOTHUB_CLIENT_ERROR;
                    IoTHubMessage_Destroy(newEntry->messageHandle);
                    free(newEntry);
                    LOG_ERROR_RESULT;
                }
                else
                {
                    newEntry->callback = eventConfirmationCallback;
                    newEntry->context = userContextCallback;
                    DList_InsertTailList(&(iotHubClientHandle->waitingToSend), &(newEntry->entry));
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
    }
    return result;
}